

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
capnp::List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<capnp::Text::Reader> value)

{
  iterator pRVar1;
  long lVar2;
  uint index_00;
  Reader *element;
  Builder l;
  Builder BStack_48;
  
  pRVar1 = value._M_array;
  init(&BStack_48,(EVP_PKEY_CTX *)this);
  index_00 = 0;
  for (lVar2 = value._M_len << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    List<capnp::Text,_(capnp::Kind)1>::Builder::set
              ((Builder *)&BStack_48,index_00,(Reader)(pRVar1->super_StringPtr).content);
    pRVar1 = pRVar1 + 1;
    index_00 = index_00 + 1;
  }
  return;
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }